

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

void help(int default_iters)

{
  puts("Benchmarks the following algorithms:");
  puts("    - ECDSA signing/verification");
  puts("    - ECDH key exchange (optional module)");
  puts("    - Schnorr signatures (optional module)");
  puts("    - ElligatorSwift (optional module)");
  putchar(10);
  printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
  puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
  putchar(10);
  puts("Usage: ./bench [args]");
  puts("By default, all benchmarks will be run.");
  puts("args:");
  puts("    help              : display this help and exit");
  puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
  puts("    ecdsa_sign        : ECDSA siging algorithm");
  puts("    ecdsa_verify      : ECDSA verification algorithm");
  puts("    ec                : all EC public key algorithms (keygen)");
  puts("    ec_keygen         : EC public key generation");
  puts("    ecdh              : ECDH key exchange algorithm");
  puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
  puts("    schnorrsig_sign   : Schnorr sigining algorithm");
  puts("    schnorrsig_verify : Schnorr verification algorithm");
  puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
  puts("    ellswift_encode   : ElligatorSwift encoding");
  puts("    ellswift_decode   : ElligatorSwift decoding");
  puts("    ellswift_keygen   : ElligatorSwift key generation");
  puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
  putchar(10);
  return;
}

Assistant:

static void help(int default_iters) {
    printf("Benchmarks the following algorithms:\n");
    printf("    - ECDSA signing/verification\n");

#ifdef ENABLE_MODULE_RECOVERY
    printf("    - Public key recovery (optional module)\n");
#endif

#ifdef ENABLE_MODULE_ECDH
    printf("    - ECDH key exchange (optional module)\n");
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    printf("    - Schnorr signatures (optional module)\n");
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    printf("    - ElligatorSwift (optional module)\n");
#endif

    printf("\n");
    printf("The default number of iterations for each benchmark is %d. This can be\n", default_iters);
    printf("customized using the SECP256K1_BENCH_ITERS environment variable.\n");
    printf("\n");
    printf("Usage: ./bench [args]\n");
    printf("By default, all benchmarks will be run.\n");
    printf("args:\n");
    printf("    help              : display this help and exit\n");
    printf("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)\n");
    printf("    ecdsa_sign        : ECDSA siging algorithm\n");
    printf("    ecdsa_verify      : ECDSA verification algorithm\n");
    printf("    ec                : all EC public key algorithms (keygen)\n");
    printf("    ec_keygen         : EC public key generation\n");

#ifdef ENABLE_MODULE_RECOVERY
    printf("    ecdsa_recover     : ECDSA public key recovery algorithm\n");
#endif

#ifdef ENABLE_MODULE_ECDH
    printf("    ecdh              : ECDH key exchange algorithm\n");
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    printf("    schnorrsig        : all Schnorr signature algorithms (sign, verify)\n");
    printf("    schnorrsig_sign   : Schnorr sigining algorithm\n");
    printf("    schnorrsig_verify : Schnorr verification algorithm\n");
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    printf("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)\n");
    printf("    ellswift_encode   : ElligatorSwift encoding\n");
    printf("    ellswift_decode   : ElligatorSwift decoding\n");
    printf("    ellswift_keygen   : ElligatorSwift key generation\n");
    printf("    ellswift_ecdh     : ECDH on ElligatorSwift keys\n");
#endif

    printf("\n");
}